

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::ShaderToPrimSpec(UsdTransform2d *node,PrimSpec *ps,string *warn,string *err)

{
  _Rb_tree_header *p_Var1;
  UsdTransform2d *pUVar2;
  PrimSpec *pPVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  PropertyMap *this;
  Property prop;
  ostringstream ss_e;
  string local_c68;
  UsdTransform2d *local_c48;
  string local_c40;
  PrimSpec *local_c20;
  undefined1 local_c18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c08;
  undefined1 local_bf8 [8];
  Variability local_bf0;
  bool local_bec;
  undefined4 local_bd8;
  undefined1 local_bd4;
  undefined1 local_bd0 [32];
  undefined1 local_bb0 [24];
  bool local_b98;
  bool local_b90 [8];
  undefined1 local_b88 [16];
  undefined1 local_b78 [8];
  undefined1 local_b70 [512];
  pointer local_970;
  Type local_968;
  undefined4 uStack_964;
  undefined1 local_960 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_950;
  undefined1 local_940 [184];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_888;
  undefined1 local_870 [24];
  ListEditQual local_858;
  undefined1 local_850 [496];
  bool local_660;
  undefined1 local_648;
  bool local_640;
  bool local_638;
  bool local_620;
  undefined1 local_618 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  Variability local_5f8;
  bool local_5f4;
  _Alloc_hider local_5f0;
  size_type local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  storage_union local_5d0;
  vtable_type *local_5c0;
  bool local_5b8;
  undefined1 local_5b0 [8];
  ios_base iStack_5a8;
  undefined7 uStack_5a7;
  undefined1 uStack_5a0;
  undefined8 uStack_59f;
  undefined1 local_590 [24];
  AttrMetas AStack_578;
  Type local_36c;
  bool local_40;
  
  Property::Property((Property *)local_c18);
  bVar4 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                    (&node->in,(Property *)local_c18,err);
  if (bVar4) {
    this = &ps->_props;
    local_c48 = node;
    local_c20 = ps;
    local_618._0_8_ = &local_608;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"inputs:in","");
    pmVar5 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::operator[](this,(key_type *)local_618);
    ::std::__cxx11::string::_M_assign((string *)pmVar5);
    (pmVar5->_attrib)._varying_authored = local_bf8[4];
    (pmVar5->_attrib)._variability = local_bf8._0_4_;
    ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
    linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)local_bd0);
    (pmVar5->_attrib)._var._blocked = (bool)local_bd0[0x18];
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_bb0);
    (pmVar5->_attrib)._var._ts._dirty = local_b98;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&(pmVar5->_attrib)._paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
    AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)local_b78);
    *(pointer *)&pmVar5->_listOpQual = local_970;
    (pmVar5->_rel).type = local_968;
    Path::operator=(&(pmVar5->_rel).targetPath,(Path *)local_960);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&(pmVar5->_rel).targetPathVector,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
    (pmVar5->_rel).listOpQual =
         (ListEditQual)
         local_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)local_870);
    (pmVar5->_rel)._varying_authored = local_850[0x1e8];
    ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
    pmVar5->_has_custom = local_640;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_618._0_8_ != &local_608) {
      operator_delete((void *)local_618._0_8_,
                      CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]) + 1)
      ;
    }
    Property::~Property((Property *)local_c18);
    Property::Property((Property *)local_c18);
    bVar4 = anon_unknown_6::ToProperty<float>(&local_c48->rotation,(Property *)local_c18,err);
    if (bVar4) {
      local_618._0_8_ = &local_608;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"inputs:rotation","");
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](this,(key_type *)local_618);
      ::std::__cxx11::string::_M_assign((string *)pmVar5);
      (pmVar5->_attrib)._varying_authored = local_bf8[4];
      (pmVar5->_attrib)._variability = local_bf8._0_4_;
      ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
      linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)local_bd0);
      (pmVar5->_attrib)._var._blocked = (bool)local_bd0[0x18];
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_bb0);
      (pmVar5->_attrib)._var._ts._dirty = local_b98;
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(pmVar5->_attrib)._paths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
      AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)local_b78);
      *(pointer *)&pmVar5->_listOpQual = local_970;
      (pmVar5->_rel).type = local_968;
      Path::operator=(&(pmVar5->_rel).targetPath,(Path *)local_960);
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                (&(pmVar5->_rel).targetPathVector,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
      (pmVar5->_rel).listOpQual =
           (ListEditQual)
           local_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)local_870);
      (pmVar5->_rel)._varying_authored = local_850[0x1e8];
      ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
      pmVar5->_has_custom = local_640;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_618._0_8_ != &local_608) {
        operator_delete((void *)local_618._0_8_,
                        CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]) +
                        1);
      }
      Property::~Property((Property *)local_c18);
      Property::Property((Property *)local_c18);
      bVar4 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                        (&local_c48->scale,(Property *)local_c18,err);
      if (bVar4) {
        local_618._0_8_ = &local_608;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"inputs:scale","");
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](this,(key_type *)local_618);
        ::std::__cxx11::string::_M_assign((string *)pmVar5);
        (pmVar5->_attrib)._varying_authored = local_bf8[4];
        (pmVar5->_attrib)._variability = local_bf8._0_4_;
        ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
        linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)local_bd0);
        (pmVar5->_attrib)._var._blocked = (bool)local_bd0[0x18];
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_bb0);
        (pmVar5->_attrib)._var._ts._dirty = local_b98;
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(pmVar5->_attrib)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
        AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)local_b78);
        *(pointer *)&pmVar5->_listOpQual = local_970;
        (pmVar5->_rel).type = local_968;
        Path::operator=(&(pmVar5->_rel).targetPath,(Path *)local_960);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&(pmVar5->_rel).targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
        (pmVar5->_rel).listOpQual =
             (ListEditQual)
             local_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)local_870);
        (pmVar5->_rel)._varying_authored = local_850[0x1e8];
        ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
        pmVar5->_has_custom = local_640;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._0_8_ != &local_608) {
          operator_delete((void *)local_618._0_8_,
                          CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0])
                          + 1);
        }
        Property::~Property((Property *)local_c18);
        Property::Property((Property *)local_c18);
        pUVar2 = local_c48;
        bVar4 = (anonymous_namespace)::ToProperty<std::array<float,2ul>>
                          (&local_c48->translation,(Property *)local_c18,err);
        if (bVar4) {
          local_618._0_8_ = &local_608;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"inputs:translation","");
          pmVar5 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](this,(key_type *)local_618);
          ::std::__cxx11::string::_M_assign((string *)pmVar5);
          (pmVar5->_attrib)._varying_authored = local_bf8[4];
          (pmVar5->_attrib)._variability = local_bf8._0_4_;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)local_bd0);
          (pmVar5->_attrib)._var._blocked = (bool)local_bd0[0x18];
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_bb0);
          (pmVar5->_attrib)._var._ts._dirty = local_b98;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar5->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b90);
          AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)local_b78);
          *(pointer *)&pmVar5->_listOpQual = local_970;
          (pmVar5->_rel).type = local_968;
          Path::operator=(&(pmVar5->_rel).targetPath,(Path *)local_960);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar5->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_940 + 0xb0));
          (pmVar5->_rel).listOpQual =
               (ListEditQual)
               local_888.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
          AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)local_870);
          (pmVar5->_rel)._varying_authored = local_850[0x1e8];
          ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
          pmVar5->_has_custom = local_640;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._0_8_ != &local_608) {
            operator_delete((void *)local_618._0_8_,
                            CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]
                                    ) + 1);
          }
          Property::~Property((Property *)local_c18);
          if ((pUVar2->result)._authored == false) {
            local_c18._0_8_ = local_c18._0_8_ & 0xffffffffffffff00;
          }
          else {
            Property::Property((Property *)local_c18);
            if ((pUVar2->result)._actual_type_name._M_string_length == 0) {
              local_c68.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
              local_c68.field_2._M_allocated_capacity._4_2_ = 0x3274;
              local_c68._M_string_length = 6;
              local_c68.field_2._M_local_buf[6] = '\0';
              local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
              Property::Property((Property *)local_618);
              local_40 = false;
              local_36c = EmptyAttrib;
              ::std::__cxx11::string::_M_assign((string *)&local_5f0);
              Property::operator=((Property *)local_c18,(Property *)local_618);
              Property::~Property((Property *)local_618);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
                operator_delete(local_c68._M_dataplus._M_p,
                                CONCAT17(local_c68.field_2._M_local_buf[7],
                                         CONCAT16(local_c68.field_2._M_local_buf[6],
                                                  CONCAT24(local_c68.field_2._M_allocated_capacity.
                                                           _4_2_,local_c68.field_2.
                                                                 _M_allocated_capacity._0_4_))) + 1)
                ;
              }
            }
            else {
              Property::Property((Property *)local_618);
              local_40 = false;
              local_36c = EmptyAttrib;
              ::std::__cxx11::string::_M_assign((string *)&local_5f0);
              Property::operator=((Property *)local_c18,(Property *)local_618);
              Property::~Property((Property *)local_618);
            }
            local_618[0] = (ostringstream)0x1;
            Property::Property((Property *)(local_618 + 8),(Property *)local_c18);
            Property::~Property((Property *)local_c18);
            local_c18[0] = (byte)local_618[0];
            if ((local_618._0_8_ & 1) != 0) {
              Property::Property((Property *)(local_c18 + 8),(Property *)(local_618 + 8));
            }
            if (((byte)local_618[0] & 1) != 0) {
              Property::~Property((Property *)(local_618 + 8));
            }
          }
          if (local_c18[0] == 1) {
            local_618._0_8_ = &local_608;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_618,"outputs:result","");
            pmVar5 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](this,(key_type *)local_618);
            ::std::__cxx11::string::_M_assign((string *)pmVar5);
            (pmVar5->_attrib)._varying_authored = local_bec;
            (pmVar5->_attrib)._variability = local_bf0;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)(local_bd0 + 8));
            (pmVar5->_attrib)._var._blocked = (bool)local_bb0[0];
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)(local_bb0 + 8));
            (pmVar5->_attrib)._var._ts._dirty = local_b90[0];
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar5->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b88);
            AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)local_b70);
            pmVar5->_listOpQual = local_968;
            pmVar5->_type = uStack_964;
            (pmVar5->_rel).type = local_960._0_4_;
            Path::operator=(&(pmVar5->_rel).targetPath,(Path *)(local_960 + 8));
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar5->_rel).targetPathVector,&local_888);
            (pmVar5->_rel).listOpQual = local_870._0_4_;
            AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)(local_870 + 8));
            (pmVar5->_rel)._varying_authored = local_660;
            ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
            pmVar5->_has_custom = local_638;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618._0_8_ != &local_608) {
              operator_delete((void *)local_618._0_8_,
                              CONCAT71(local_608._M_allocated_capacity._1_7_,
                                       local_608._M_local_buf[0]) + 1);
            }
          }
          if ((local_c18[0] & 1) != 0) {
            Property::~Property((Property *)(local_c18 + 8));
          }
          p_Var7 = *(_Base_ptr *)
                    ((long)&(pUVar2->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                            super__Rb_tree_header._M_header + 0x10);
          p_Var1 = &(pUVar2->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                    super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var7 != p_Var1) {
            do {
              local_c18._0_8_ = &local_c08;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c18,*(long *)(p_Var7 + 1),
                         (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
              Property::Property((Property *)local_bf8,(Property *)(p_Var7 + 2));
              pmVar5 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       ::operator[](this,(key_type *)local_c18);
              ::std::__cxx11::string::_M_assign((string *)pmVar5);
              (pmVar5->_attrib)._varying_authored = (bool)local_bd4;
              (pmVar5->_attrib)._variability = local_bd8;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
              linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)local_bb0);
              (pmVar5->_attrib)._var._blocked = local_b98;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_b90);
              (pmVar5->_attrib)._var._ts._dirty = local_b78[0];
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar5->_attrib)._paths,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_b70);
              AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)(local_b70 + 0x18));
              pmVar5->_listOpQual = local_950._M_allocated_capacity._0_4_;
              pmVar5->_type = local_950._M_allocated_capacity._4_4_;
              (pmVar5->_rel).type = local_950._8_4_;
              Path::operator=(&(pmVar5->_rel).targetPath,(Path *)local_940);
              ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar5->_rel).targetPathVector,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_870);
              (pmVar5->_rel).listOpQual = local_858;
              AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)local_850);
              (pmVar5->_rel)._varying_authored = (bool)local_648;
              ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
              pmVar5->_has_custom = local_620;
              Property::~Property((Property *)local_bf8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c18._0_8_ != &local_c08) {
                operator_delete((void *)local_c18._0_8_,local_c08._M_allocated_capacity + 1);
              }
              p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
            } while ((_Rb_tree_header *)p_Var7 != p_Var1);
          }
          local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
          local_c68._M_string_length = 0;
          local_c68.field_2._M_allocated_capacity._0_4_ =
               local_c68.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          ::std::__cxx11::string::_M_replace((ulong)&local_c68,0,(char *)0x0,0x40bc83);
          local_618._0_8_ = &local_608;
          local_618._8_8_ = 0;
          local_608._M_local_buf[0] = '\0';
          local_5f8 = Varying;
          local_5f4 = false;
          local_5e8 = 0;
          local_5e0._M_local_buf[0] = '\0';
          local_5c0 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_5d0.dynamic = (void *)0x0;
          local_5b8 = false;
          local_5b0 = (undefined1  [8])0x0;
          iStack_5a8 = (ios_base)0x0;
          uStack_5a7 = 0;
          uStack_5a0 = 0;
          uStack_59f = 0;
          AStack_578.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          AStack_578.elementSize.has_value_ = false;
          AStack_578.elementSize.contained = (storage_t<unsigned_int>)0x0;
          AStack_578.hidden.has_value_ = false;
          AStack_578.hidden.contained = (storage_t<bool>)0x0;
          AStack_578.comment.has_value_ = false;
          AStack_578.weight.contained = (storage_t<double>)0x0;
          AStack_578.connectability.has_value_ = false;
          AStack_578.bindMaterialAs.contained._16_8_ = 0;
          AStack_578.bindMaterialAs.contained._24_8_ = 0;
          AStack_578.bindMaterialAs.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.bindMaterialAs.contained._8_8_ = 0;
          AStack_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&AStack_578.meta._M_t._M_impl + 8);
          AStack_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          AStack_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          AStack_578.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.comment.contained._8_8_ = 0;
          AStack_578.comment.contained._16_8_ = 0;
          AStack_578.comment.contained._24_8_ = 0;
          AStack_578.comment.contained._32_8_ = 0;
          AStack_578.comment.contained._40_8_ = 0;
          AStack_578.customData.has_value_ = false;
          AStack_578.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.customData.contained._8_8_ = 0;
          AStack_578.customData.contained._16_8_ = 0;
          AStack_578.customData.contained._24_8_ = 0;
          AStack_578.customData.contained._32_8_ = 0;
          AStack_578.customData.contained._40_8_ = 0;
          AStack_578.weight.has_value_ = false;
          AStack_578.connectability.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.connectability.contained._8_8_ = 0;
          AStack_578.connectability.contained._16_8_ = 0;
          AStack_578.connectability.contained._24_8_ = 0;
          AStack_578.outputName.has_value_ = false;
          AStack_578.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.outputName.contained._8_8_ = 0;
          AStack_578.outputName.contained._16_8_ = 0;
          AStack_578.outputName.contained._24_8_ = 0;
          AStack_578.renderType.has_value_ = false;
          AStack_578.sdrMetadata.has_value_ = false;
          AStack_578.renderType.contained._16_8_ = 0;
          AStack_578.renderType.contained._24_8_ = 0;
          AStack_578.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.renderType.contained._8_8_ = 0;
          AStack_578.displayName.has_value_ = false;
          AStack_578.sdrMetadata.contained._32_8_ = 0;
          AStack_578.sdrMetadata.contained._40_8_ = 0;
          AStack_578.sdrMetadata.contained._16_8_ = 0;
          AStack_578.sdrMetadata.contained._24_8_ = 0;
          AStack_578.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.sdrMetadata.contained._8_8_ = 0;
          AStack_578.displayGroup.has_value_ = false;
          AStack_578.displayName.contained._16_8_ = 0;
          AStack_578.displayName.contained._24_8_ = 0;
          AStack_578.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_578.displayName.contained._8_8_ = 0;
          AStack_578.bindMaterialAs.has_value_ = false;
          AStack_578.displayGroup.contained._16_8_ = 0;
          AStack_578.displayGroup.contained._24_8_ = 0;
          AStack_578.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
          ;
          AStack_578.displayGroup.contained._8_8_ = 0;
          local_590[0x10] = 0;
          stack0xfffffffffffffa81 = 0;
          local_590._0_8_ = (pointer)0x0;
          local_590[8] = 0;
          local_590._9_7_ = 0;
          AStack_578.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          AStack_578.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          AStack_578.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          AStack_578.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_5f0._M_p = (pointer)&local_5e0;
          AStack_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               AStack_578.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Attribute::set_value<tinyusdz::Token>((Attribute *)local_618,(Token *)&local_c68);
          local_5f8 = Uniform;
          Property::Property((Property *)local_c18,(Attribute *)local_618,false);
          local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c40,"info:id","");
          pmVar5 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](this,&local_c40);
          Property::operator=(pmVar5,(Property *)local_c18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c40._M_dataplus._M_p != &local_c40.field_2) {
            operator_delete(local_c40._M_dataplus._M_p,local_c40.field_2._M_allocated_capacity + 1);
          }
          Property::~Property((Property *)local_c18);
          AttrMetas::~AttrMetas(&AStack_578);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_590);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_5b0);
          if (local_5c0 != (vtable_type *)0x0) {
            (*local_5c0->destroy)(&local_5d0);
            local_5c0 = (vtable_type *)0x0;
          }
          pUVar2 = local_c48;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f0._M_p != &local_5e0) {
            operator_delete(local_5f0._M_p,
                            CONCAT71(local_5e0._M_allocated_capacity._1_7_,local_5e0._M_local_buf[0]
                                    ) + 1);
          }
          pPVar3 = local_c20;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_618._0_8_ != &local_608) {
            operator_delete((void *)local_618._0_8_,
                            CONCAT71(local_608._M_allocated_capacity._1_7_,local_608._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
            operator_delete(local_c68._M_dataplus._M_p,
                            CONCAT17(local_c68.field_2._M_local_buf[7],
                                     CONCAT16(local_c68.field_2._M_local_buf[6],
                                              CONCAT24(local_c68.field_2._M_allocated_capacity._4_2_
                                                       ,local_c68.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          PrimMetas::operator=(&pPVar3->_metas,&(pUVar2->super_ShaderNode).super_UsdShadePrim.meta);
          ::std::__cxx11::string::_M_assign((string *)&pPVar3->_name);
          pPVar3->_specifier = (pUVar2->super_ShaderNode).super_UsdShadePrim.spec;
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_618,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_618,"ShaderToPrimSpec",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x906);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c40,"Convert {} to Property failed.\n","");
        fmt::format<char[19]>(&local_c68,&local_c40,(char (*) [19])"inputs:translation");
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_618,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_618,"ShaderToPrimSpec",0x10);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x905);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c40,"Convert {} to Property failed.\n","");
        fmt::format<char[13]>(&local_c68,&local_c40,(char (*) [13])"inputs:scale");
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_618,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_618,"ShaderToPrimSpec",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x904);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c40,"Convert {} to Property failed.\n","");
      fmt::format<char[16]>(&local_c68,&local_c40,(char (*) [16])"inputs:rotation");
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_618,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_618,"ShaderToPrimSpec",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_618,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_618,0x903);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    local_c40._M_dataplus._M_p = (pointer)&local_c40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c40,"Convert {} to Property failed.\n","");
    fmt::format<char[10]>(&local_c68,&local_c40,(char (*) [10])"inputs:in");
  }
  poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_618,local_c68._M_dataplus._M_p,local_c68._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p,
                    CONCAT17(local_c68.field_2._M_local_buf[7],
                             CONCAT16(local_c68.field_2._M_local_buf[6],
                                      CONCAT24(local_c68.field_2._M_allocated_capacity._4_2_,
                                               local_c68.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c40._M_dataplus._M_p != &local_c40.field_2) {
    operator_delete(local_c40._M_dataplus._M_p,local_c40.field_2._M_allocated_capacity + 1);
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_c68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
      operator_delete(local_c68._M_dataplus._M_p,
                      CONCAT17(local_c68.field_2._M_local_buf[7],
                               CONCAT16(local_c68.field_2._M_local_buf[6],
                                        CONCAT24(local_c68.field_2._M_allocated_capacity._4_2_,
                                                 local_c68.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
  ::std::ios_base::~ios_base(&iStack_5a8);
  Property::~Property((Property *)local_c18);
  return false;
}

Assistant:

bool ShaderToPrimSpec(const UsdTransform2d &node, PrimSpec &ps,
                      std::string *warn, std::string *err) {
  (void)warn;

#define TO_PROPERTY(__prop_name, __v)                                    \
  {                                                                      \
    Property prop;                                                       \
    if (!ToProperty(__v, prop, err)) {                                   \
      PUSH_ERROR_AND_RETURN(                                             \
          fmt::format("Convert {} to Property failed.\n", __prop_name)); \
    }                                                                    \
    ps.props()[__prop_name] = prop;                                      \
  }

  // inputs
  TO_PROPERTY("inputs:in", node.in)
  TO_PROPERTY("inputs:rotation", node.rotation)
  TO_PROPERTY("inputs:scale", node.scale)
  TO_PROPERTY("inputs:translation", node.translation)

  // outputs
  if (auto pv = TypedTerminalAttributeToProperty(node.result)) {
    ps.props()["outputs:result"] = pv.value();
  }

  for (auto prop : node.props) {
    ps.props()[prop.first] = prop.second;
  }

  ps.props()[kInfoId] =
      Property(Attribute::Uniform(value::token(kUsdTransform2d)));
  ps.metas() = node.metas();
  ps.name() = node.name;
  ps.specifier() = node.spec;

  return true;
}